

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.c
# Opt level: O2

ZyanStatus
ZydisEncoderDecodedInstructionToEncoderRequest
          (ZydisDecodedInstruction *instruction,ZydisDecodedOperand *operands,
          ZyanU8 operand_count_visible,ZydisEncoderRequest *request)

{
  byte bVar1;
  ZydisInstructionEncoding ZVar2;
  ZydisMaskMode ZVar3;
  ZydisOperandType ZVar4;
  ulong uVar5;
  uint uVar6;
  ZydisAddressSizeHint ZVar7;
  ZydisDecodedInstructionAvxSwizzle_ ZVar8;
  ZydisBranchType ZVar9;
  ZydisBroadcastMode ZVar10;
  long lVar11;
  uint uVar12;
  ZyanStatus ZVar13;
  ZyanU8 ZVar14;
  ZydisOperandEncoding *pZVar15;
  ZyanBool ZVar16;
  
  ZVar13 = 0x80100004;
  if (((request != (ZydisEncoderRequest *)0x0 && instruction != (ZydisDecodedInstruction *)0x0) &&
      (operands != (ZydisDecodedOperand *)0x0 || operand_count_visible == '\0')) &&
     (instruction->operand_count_visible == operand_count_visible)) {
    memset(request,0,400);
    request->machine_mode = instruction->machine_mode;
    request->mnemonic = instruction->mnemonic;
    uVar5 = instruction->attributes;
    request->prefixes = uVar5 & 0x7fff8000000;
    ZVar9 = (instruction->meta).branch_type;
    request->branch_type = ZVar9;
    if (((uint)uVar5 >> 0x1a & 1) == 0) {
      request->prefixes = uVar5 & 0x1ff8000000;
    }
    ZVar14 = instruction->address_width;
    if (ZVar14 == '\x10') {
      ZVar7 = ZYDIS_ADDRESS_SIZE_HINT_16;
    }
    else if (ZVar14 == '@') {
      ZVar7 = ZYDIS_ADDRESS_SIZE_HINT_64;
    }
    else {
      if (ZVar14 != ' ') {
        return 0x80100004;
      }
      ZVar7 = ZYDIS_ADDRESS_SIZE_HINT_32;
    }
    request->address_size_hint = ZVar7;
    bVar1 = instruction->operand_width;
    uVar6 = bVar1 - 8 >> 3;
    uVar12 = (uint)bVar1 << 0x1d | uVar6;
    if ((uVar12 < 8) && ((0x8bU >> (uVar6 & 0x1f) & 1) != 0)) {
      request->operand_size_hint = *(ZydisOperandSizeHint *)(&DAT_0010ad24 + (ulong)uVar12 * 4);
      if (ZYDIS_BRANCH_TYPE_SHORT < ZVar9) {
        if (1 < ZVar9 - ZYDIS_BRANCH_TYPE_NEAR) {
          return 0x80100004;
        }
        if (bVar1 == 0x10) {
          ZVar9 = ZYDIS_BRANCH_TYPE_NEAR;
        }
        else if (bVar1 == 0x40) {
          ZVar9 = 4;
        }
        else {
          if (bVar1 != 0x20) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                          ,0x1242,
                          "ZyanStatus ZydisEncoderDecodedInstructionToEncoderRequest(const ZydisDecodedInstruction *, const ZydisDecodedOperand *, ZyanU8, ZydisEncoderRequest *)"
                         );
          }
          ZVar9 = ZYDIS_BRANCH_TYPE_FAR;
        }
      }
      request->branch_width = ZVar9;
      ZVar2 = instruction->encoding;
      if (ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS < ZVar2) {
        if (ZVar2 == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
          ZVar10 = ZYDIS_BROADCAST_MODE_INVALID;
          if ((instruction->avx).broadcast.is_static == '\0') {
            ZVar10 = (instruction->avx).broadcast.mode;
          }
          (request->mvex).broadcast = ZVar10;
          (request->mvex).conversion = (instruction->avx).conversion.mode;
          ZVar8.mode = (instruction->avx).swizzle.mode;
          (request->mvex).rounding = (instruction->avx).rounding.mode;
          (request->mvex).swizzle = ZVar8.mode;
          (request->mvex).sae = (instruction->avx).has_sae;
          ZVar16 = (instruction->avx).has_eviction_hint;
          lVar11 = 0x18d;
        }
        else {
          if (ZVar2 != ZYDIS_INSTRUCTION_ENCODING_EVEX) {
            return 0x80100004;
          }
          ZVar10 = ZYDIS_BROADCAST_MODE_INVALID;
          if ((instruction->avx).broadcast.is_static == '\0') {
            ZVar10 = (instruction->avx).broadcast.mode;
          }
          (request->evex).broadcast = ZVar10;
          (request->evex).rounding = (instruction->avx).rounding.mode;
          (request->evex).sae = (instruction->avx).has_sae;
          ZVar3 = (instruction->avx).mask.mode;
          lVar11 = 0x179;
          if ((ZVar3 == ZYDIS_MASK_MODE_CONTROL_ZEROING) || (ZVar3 == ZYDIS_MASK_MODE_REQUIRED_BITS)
             ) {
            ZVar16 = (instruction->raw).field_3.xop.offset != '\0';
          }
          else {
            ZVar16 = '\0';
          }
        }
        *(ZyanBool *)((long)request->operands + lVar11 + -0x30) = ZVar16;
      }
      request->allowed_encodings = 1 << ((byte)ZVar2 & 0x1f);
      request->operand_count = operand_count_visible;
      pZVar15 = &operands->encoding;
      for (lVar11 = 0; (ulong)operand_count_visible * 0x40 != lVar11; lVar11 = lVar11 + 0x40) {
        ZVar4 = pZVar15[5];
        *(ZydisOperandType *)((long)&request->operands[0].type + lVar11) = ZVar4;
        switch(ZVar4) {
        case ZYDIS_OPERAND_TYPE_REGISTER:
          *(ZydisRegister *)((long)&request->operands[0].reg.value + lVar11) =
               (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)(pZVar15 + 7))->reg).value;
          (&request->operands[0].reg.is4)[lVar11] = *pZVar15 == ZYDIS_OPERAND_ENCODING_IS4;
          break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
          *(ZydisOperandEncoding *)((long)&request->operands[0].mem.base + lVar11) = pZVar15[9];
          *(ZydisOperandEncoding *)((long)&request->operands[0].mem.index + lVar11) = pZVar15[10];
          if ((((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)(pZVar15 + 7))->mem).type ==
              ZYDIS_MEMOP_TYPE_MIB) {
            ZVar14 = '\0';
          }
          else {
            ZVar14 = (ZyanU8)pZVar15[0xb];
          }
          (&request->operands[0].mem.scale)[lVar11] = ZVar14;
          if (*(char *)((long)pZVar15 + 0x3d) != '\0') {
            *(undefined8 *)((long)&request->operands[0].mem.displacement + lVar11) =
                 *(undefined8 *)(pZVar15 + 0xd);
          }
          *(ushort *)((long)&request->operands[0].mem.size + lVar11) = *(ushort *)(pZVar15 + 1) >> 3
          ;
          break;
        case ZYDIS_OPERAND_TYPE_POINTER:
          *(ZyanU16 *)((long)&request->operands[0].ptr.segment + lVar11) =
               (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)(pZVar15 + 7))->ptr).
               segment;
          *(ZydisOperandEncoding *)((long)&request->operands[0].ptr.offset + lVar11) = pZVar15[8];
          break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
          *(undefined8 *)((long)&request->operands[0].imm + lVar11) = *(undefined8 *)(pZVar15 + 9);
          if ((*(char *)((long)pZVar15 + 0x1d) != '\0') &&
             (instruction->mnemonic != ZYDIS_MNEMONIC_XBEGIN)) {
            ZVar14 = (instruction->raw).imm[0].size;
            if (ZVar14 == ' ') {
              request->branch_width = ZYDIS_BRANCH_WIDTH_32;
            }
            else if (ZVar14 == '\x10') {
              request->branch_width = ZYDIS_BRANCH_WIDTH_16;
            }
            else {
              if (ZVar14 != '\b') {
                return 0x80100004;
              }
              request->branch_width = ZYDIS_BRANCH_WIDTH_8;
            }
          }
          break;
        default:
          goto switchD_00107d96_default;
        }
        pZVar15 = pZVar15 + 0x14;
      }
      ZVar13 = 0x100000;
    }
  }
switchD_00107d96_default:
  return ZVar13;
}

Assistant:

ZYDIS_EXPORT ZyanStatus ZydisEncoderDecodedInstructionToEncoderRequest(
        const ZydisDecodedInstruction *instruction, const ZydisDecodedOperand* operands,
        ZyanU8 operand_count_visible, ZydisEncoderRequest *request)
{
    if (!instruction || !request || (operand_count_visible && !operands) ||
        operand_count_visible != instruction->operand_count_visible)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZYAN_MEMSET(request, 0, sizeof(ZydisEncoderRequest));
    request->machine_mode = instruction->machine_mode;
    request->mnemonic = instruction->mnemonic;
    request->prefixes = instruction->attributes & ZYDIS_ENCODABLE_PREFIXES;
    request->branch_type = instruction->meta.branch_type;
    if (!(instruction->attributes & ZYDIS_ATTRIB_ACCEPTS_SEGMENT))
    {
        request->prefixes &= ~ZYDIS_ATTRIB_HAS_SEGMENT;
    }

    switch (instruction->address_width)
    {
    case 16:
        request->address_size_hint = ZYDIS_ADDRESS_SIZE_HINT_16;
        break;
    case 32:
        request->address_size_hint = ZYDIS_ADDRESS_SIZE_HINT_32;
        break;
    case 64:
        request->address_size_hint = ZYDIS_ADDRESS_SIZE_HINT_64;
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    switch (instruction->operand_width)
    {
    case 8:
        request->operand_size_hint = ZYDIS_OPERAND_SIZE_HINT_8;
        break;
    case 16:
        request->operand_size_hint = ZYDIS_OPERAND_SIZE_HINT_16;
        break;
    case 32:
        request->operand_size_hint = ZYDIS_OPERAND_SIZE_HINT_32;
        break;
    case 64:
        request->operand_size_hint = ZYDIS_OPERAND_SIZE_HINT_64;
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    switch (request->branch_type)
    {
    case ZYDIS_BRANCH_TYPE_NONE:
        request->branch_width = ZYDIS_BRANCH_WIDTH_NONE;
        break;
    case ZYDIS_BRANCH_TYPE_SHORT:
        request->branch_width = ZYDIS_BRANCH_WIDTH_8;
        break;
    case ZYDIS_BRANCH_TYPE_NEAR:
    case ZYDIS_BRANCH_TYPE_FAR:
        switch (instruction->operand_width)
        {
        case 16:
            request->branch_width = ZYDIS_BRANCH_WIDTH_16;
            break;
        case 32:
            request->branch_width = ZYDIS_BRANCH_WIDTH_32;
            break;
        case 64:
            request->branch_width = ZYDIS_BRANCH_WIDTH_64;
            break;
        default:
            ZYAN_UNREACHABLE;
        }
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    switch (instruction->encoding)
    {
    case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
    case ZYDIS_INSTRUCTION_ENCODING_3DNOW:
    case ZYDIS_INSTRUCTION_ENCODING_XOP:
    case ZYDIS_INSTRUCTION_ENCODING_VEX:
        break;
    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        request->evex.broadcast = !instruction->avx.broadcast.is_static ?
            instruction->avx.broadcast.mode : ZYDIS_BROADCAST_MODE_INVALID;
        request->evex.rounding = instruction->avx.rounding.mode;
        request->evex.sae = instruction->avx.has_sae;
        request->evex.zeroing_mask = (instruction->avx.mask.mode == ZYDIS_MASK_MODE_ZEROING ||
            instruction->avx.mask.mode == ZYDIS_MASK_MODE_CONTROL_ZEROING) &&
            (instruction->raw.evex.z) ? ZYAN_TRUE : ZYAN_FALSE;
        break;
    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
        request->mvex.broadcast = !instruction->avx.broadcast.is_static ?
            instruction->avx.broadcast.mode : ZYDIS_BROADCAST_MODE_INVALID;
        request->mvex.conversion = instruction->avx.conversion.mode;
        request->mvex.rounding = instruction->avx.rounding.mode;
        request->mvex.swizzle = instruction->avx.swizzle.mode;
        request->mvex.sae = instruction->avx.has_sae;
        request->mvex.eviction_hint = instruction->avx.has_eviction_hint;
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    request->allowed_encodings = 1 << instruction->encoding;

    request->operand_count = operand_count_visible;
    for (ZyanU8 i = 0; i < operand_count_visible; ++i)
    {
        const ZydisDecodedOperand *dec_op = &operands[i];
        ZydisEncoderOperand *enc_op = &request->operands[i];

        enc_op->type = dec_op->type;
        switch (dec_op->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            enc_op->reg.value = dec_op->reg.value;
            enc_op->reg.is4 = dec_op->encoding == ZYDIS_OPERAND_ENCODING_IS4;
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            enc_op->mem.base = dec_op->mem.base;
            enc_op->mem.index = dec_op->mem.index;
            enc_op->mem.scale = dec_op->mem.type != ZYDIS_MEMOP_TYPE_MIB ? dec_op->mem.scale : 0;
            if (dec_op->mem.disp.size)
            {
                enc_op->mem.displacement = dec_op->mem.disp.value;
            }
            enc_op->mem.size = dec_op->size / 8;
            break;
        case ZYDIS_OPERAND_TYPE_POINTER:
            enc_op->ptr.segment = dec_op->ptr.segment;
            enc_op->ptr.offset = dec_op->ptr.offset;
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            enc_op->imm.u = dec_op->imm.value.u;
            // `XBEGIN` is an ISA-wide unique instruction because it's not a branching instruction
            // but it has a relative operand which behaves differently from all other relatives
            // (no truncating behavior in 16-bit mode). Encoder treats it as non-branching
            // instruction that scales with hidden operand size.
            if ((dec_op->imm.is_relative) &&
                (instruction->mnemonic != ZYDIS_MNEMONIC_XBEGIN))
            {
                switch (instruction->raw.imm->size)
                {
                case 8:
                    request->branch_width = ZYDIS_BRANCH_WIDTH_8;
                    break;
                case 16:
                    request->branch_width = ZYDIS_BRANCH_WIDTH_16;
                    break;
                case 32:
                    request->branch_width = ZYDIS_BRANCH_WIDTH_32;
                    break;
                default:
                    return ZYAN_STATUS_INVALID_ARGUMENT;
                }
            }
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
    }

    return ZYAN_STATUS_SUCCESS;
}